

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesCacheEntryComposite.cxx
# Opt level: O1

void __thiscall
cmCursesCacheEntryComposite::cmCursesCacheEntryComposite
          (cmCursesCacheEntryComposite *this,string *key,int labelwidth,int entrywidth)

{
  pointer pcVar1;
  _Head_base<0UL,_cmCursesLabelWidget_*,_false> _Var2;
  cmCursesLabelWidget *pcVar3;
  cmCursesWidget *pcVar4;
  _Head_base<0UL,_cmCursesLabelWidget_*,_false> this_00;
  cmCursesLabelWidget *this_01;
  cmCursesStringWidget *this_02;
  pointer *__ptr;
  string local_50;
  
  (this->Label)._M_t.
  super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
  super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl = (cmCursesLabelWidget *)0x0;
  (this->IsNewLabel)._M_t.
  super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
  super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl = (cmCursesLabelWidget *)0x0;
  (this->Entry)._M_t.super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>.
  _M_t.super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
  super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl = (cmCursesWidget *)0x0;
  (this->Key)._M_dataplus._M_p = (pointer)&(this->Key).field_2;
  pcVar1 = (key->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Key,pcVar1,pcVar1 + key->_M_string_length);
  this->LabelWidth = labelwidth;
  this->EntryWidth = entrywidth;
  this_00._M_head_impl = (cmCursesLabelWidget *)operator_new(0x40);
  cmCursesLabelWidget::cmCursesLabelWidget(this_00._M_head_impl,labelwidth,1,1,1,key);
  _Var2._M_head_impl =
       (this->Label)._M_t.
       super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
       super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
       super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl;
  (this->Label)._M_t.
  super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
  super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl = this_00._M_head_impl;
  if (_Var2._M_head_impl != (cmCursesLabelWidget *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_cmCursesWidget + 8))();
  }
  this_01 = (cmCursesLabelWidget *)operator_new(0x40);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50," ","");
  cmCursesLabelWidget::cmCursesLabelWidget(this_01,1,1,1,1,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->IsNewLabel)._M_t.
           super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
           super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl;
  (this->IsNewLabel)._M_t.
  super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
  super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl = this_01;
  if (pcVar3 != (cmCursesLabelWidget *)0x0) {
    (**(code **)((long)(pcVar3->super_cmCursesWidget)._vptr_cmCursesWidget + 8))();
  }
  this_02 = (cmCursesStringWidget *)operator_new(0x68);
  cmCursesStringWidget::cmCursesStringWidget(this_02,this->EntryWidth,1,1,1);
  pcVar4 = (this->Entry)._M_t.
           super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>._M_t.
           super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
           super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl;
  (this->Entry)._M_t.super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>.
  _M_t.super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
  super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl = (cmCursesWidget *)this_02;
  if (pcVar4 != (cmCursesWidget *)0x0) {
    (*pcVar4->_vptr_cmCursesWidget[1])();
  }
  return;
}

Assistant:

cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(
  const std::string& key, int labelwidth, int entrywidth)
  : Key(key)
  , LabelWidth(labelwidth)
  , EntryWidth(entrywidth)
{
  this->Label =
    cm::make_unique<cmCursesLabelWidget>(this->LabelWidth, 1, 1, 1, key);
  this->IsNewLabel = cm::make_unique<cmCursesLabelWidget>(1, 1, 1, 1, " ");
  this->Entry =
    cm::make_unique<cmCursesStringWidget>(this->EntryWidth, 1, 1, 1);
}